

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDefaultInstanceAllocator
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *field;
  FieldGenerator *pFVar2;
  int local_1c;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(this->descriptor_);
    if (iVar1 <= local_1c) break;
    field = Descriptor::field(this->descriptor_,local_1c);
    pFVar2 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar2->_vptr_FieldGenerator[0x11])(pFVar2,printer);
    local_1c = local_1c + 1;
  }
  io::Printer::Print(printer,"_$classname$_default_instance_.DefaultConstruct();\n","classname",
                     &this->classname_);
  return;
}

Assistant:

void MessageGenerator::
GenerateDefaultInstanceAllocator(io::Printer* printer) {
  // Construct the default instances of all fields, as they will be used
  // when creating the default instance of the entire message.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateDefaultInstanceAllocator(printer);
  }

  // Construct the default instance.  We can't call InitAsDefaultInstance() yet
  // because we need to make sure all default instances that this one might
  // depend on are constructed first.
  printer->Print("_$classname$_default_instance_.DefaultConstruct();\n",
                 "classname", classname_);
}